

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

string * anon_unknown.dwarf_d849::cpputf8_u32_to_u8(string *__return_storage_ptr__,u32string *u32)

{
  const_iterator start;
  const_iterator end;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  u32string *u32_local;
  string *u8;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  start = std::begin<std::__cxx11::u32string>(u32);
  end = std::end<std::__cxx11::u32string>(u32);
  result = std::back_inserter<std::__cxx11::string>(__return_storage_ptr__);
  utf8::
  utf32to8<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>>
            ((__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )start._M_current,
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )end._M_current,result);
  return __return_storage_ptr__;
}

Assistant:

inline
string cpputf8_u32_to_u8(const u32string& u32)
{
    string u8;
    utf8::utf32to8(std::begin(u32), std::end(u32), std::back_inserter(u8));
    return u8;
}